

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O0

void __thiscall
QPDF::optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
          (QPDF *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          *object_stream_data,bool allow_changes,
          function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  bool bVar1;
  pointer pMVar2;
  size_t __n;
  reference pvVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  QPDFObjGen local_2d0;
  QPDFObjGen root_og;
  ObjUser root_ou;
  QPDFObjectHandle local_280;
  ObjUser local_270;
  BaseHandle *local_248;
  type *value_1;
  type *key_1;
  _Self local_230;
  iterator __end1_1;
  iterator __begin1_1;
  Dictionary *__range1_1;
  QPDFObjectHandle local_1e8;
  ObjUser local_1d8;
  BaseHandle *local_1b0;
  type *value;
  type *key;
  _Self local_198;
  iterator __end1;
  iterator __begin1;
  Dictionary *__range1;
  QPDFObjectHandle local_150;
  ObjUser local_140;
  int local_114;
  size_type sStack_110;
  int pageno;
  int local_104;
  undefined1 local_100 [4];
  int n;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  QPDFObjectHandle outlines;
  allocator<char> local_69;
  string local_68 [32];
  QPDFObjectHandle local_48;
  undefined1 local_38 [8];
  QPDFObjectHandle root;
  function<int_(QPDFObjectHandle_&)> *skip_stream_parameters_local;
  bool allow_changes_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *object_stream_data_local;
  QPDF *this_local;
  
  root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)skip_stream_parameters;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = std::
          map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
          ::empty(&pMVar2->obj_user_to_objects);
  if (bVar1) {
    getRoot((QPDF *)local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_68,"/Outlines",&local_69);
    QPDFObjectHandle::getKey(&local_48,(string *)local_38);
    bVar1 = QPDFObjectHandle::isDictionary(&local_48);
    QPDFObjectHandle::~QPDFObjectHandle(&local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b0,"/Outlines",&local_b1);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_90,(string *)local_38);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_90);
      if (!bVar1) {
        QTC::TC("qpdf","QPDF_optimization indirect outlines",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"/Outlines",&local_d9);
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)local_100,(QPDFObjectHandle *)local_90);
        makeIndirectObject((QPDF *)&local_f0,(QPDFObjectHandle *)this);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_38,&local_d8,&local_f0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
        std::__cxx11::string::~string((string *)&local_d8);
        std::allocator<char>::~allocator(&local_d9);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
    }
    pushInheritedAttributesToPage(this,allow_changes,false);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    sStack_110 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                           (&pMVar2->all_pages);
    local_104 = toI<unsigned_long>(&stack0xfffffffffffffef0);
    for (local_114 = 0; local_114 < local_104; local_114 = local_114 + 1) {
      ObjUser::ObjUser(&local_140,ou_page,local_114);
      pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      __n = toS<int>(&local_114);
      pvVar3 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                         (&pMVar2->all_pages,__n);
      QPDFObjectHandle::QPDFObjectHandle(&local_150,pvVar3);
      std::function<int_(QPDFObjectHandle_&)>::function
                ((function<int_(QPDFObjectHandle_&)> *)&__range1,skip_stream_parameters);
      updateObjectMaps(this,&local_140,&local_150,(function<int_(QPDFObjectHandle_&)> *)&__range1);
      std::function<int_(QPDFObjectHandle_&)>::~function
                ((function<int_(QPDFObjectHandle_&)> *)&__range1);
      QPDFObjectHandle::~QPDFObjectHandle(&local_150);
      ObjUser::~ObjUser(&local_140);
    }
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin1,(char)pMVar2 + 8);
    __end1 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin1);
    local_198._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin1);
    while (bVar1 = std::operator!=(&__end1,&local_198), bVar1) {
      key = &std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end1)->first;
      value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
      local_1b0 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                               *)key)->super_BaseHandle;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value,"/Root");
      if ((!bVar1) && (bVar1 = ::qpdf::BaseHandle::null(local_1b0), !bVar1)) {
        ObjUser::ObjUser(&local_1d8,ou_trailer_key,(string *)value);
        QPDFObjectHandle::QPDFObjectHandle(&local_1e8,(QPDFObjectHandle *)local_1b0);
        std::function<int_(QPDFObjectHandle_&)>::function
                  ((function<int_(QPDFObjectHandle_&)> *)&__range1_1,skip_stream_parameters);
        updateObjectMaps(this,&local_1d8,&local_1e8,
                         (function<int_(QPDFObjectHandle_&)> *)&__range1_1);
        std::function<int_(QPDFObjectHandle_&)>::~function
                  ((function<int_(QPDFObjectHandle_&)> *)&__range1_1);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1e8);
        ObjUser::~ObjUser(&local_1d8);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end1);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin1);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin1_1,(typed)local_38);
    __end1_1 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin1_1);
    local_230._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin1_1);
    while (bVar1 = std::operator!=(&__end1_1,&local_230), bVar1) {
      key_1 = &std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
               ::operator*(&__end1_1)->first;
      value_1 = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                    *)key_1);
      local_248 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                               *)key_1)->super_BaseHandle;
      bVar1 = ::qpdf::BaseHandle::null(local_248);
      if (!bVar1) {
        ObjUser::ObjUser(&local_270,ou_root_key,(string *)value_1);
        QPDFObjectHandle::QPDFObjectHandle(&local_280,(QPDFObjectHandle *)local_248);
        std::function<int_(QPDFObjectHandle_&)>::function
                  ((function<int_(QPDFObjectHandle_&)> *)((long)&root_ou.key.field_2 + 8),
                   skip_stream_parameters);
        updateObjectMaps(this,&local_270,&local_280,
                         (function<int_(QPDFObjectHandle_&)> *)((long)&root_ou.key.field_2 + 8));
        std::function<int_(QPDFObjectHandle_&)>::~function
                  ((function<int_(QPDFObjectHandle_&)> *)((long)&root_ou.key.field_2 + 8));
        QPDFObjectHandle::~QPDFObjectHandle(&local_280);
        ObjUser::~ObjUser(&local_270);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end1_1);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin1_1);
    ObjUser::ObjUser((ObjUser *)&root_og,ou_root);
    local_2d0 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)local_38);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::
              map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
              ::operator[](&pMVar2->obj_user_to_objects,(key_type *)&root_og);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::insert
              (this_00,&local_2d0);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_01 = std::
              map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
              ::operator[](&pMVar2->object_to_obj_users,&local_2d0);
    std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>::insert
              (this_01,(value_type *)&root_og);
    filterCompressedObjects(this,object_stream_data);
    ObjUser::~ObjUser((ObjUser *)&root_og);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  }
  return;
}

Assistant:

void
QPDF::optimize_internal(
    T const& object_stream_data,
    bool allow_changes,
    std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
{
    if (!m->obj_user_to_objects.empty()) {
        // already optimized
        return;
    }

    // The PDF specification indicates that /Outlines is supposed to be an indirect reference. Force
    // it to be so if it exists and is direct.  (This has been seen in the wild.)
    QPDFObjectHandle root = getRoot();
    if (root.getKey("/Outlines").isDictionary()) {
        QPDFObjectHandle outlines = root.getKey("/Outlines");
        if (!outlines.isIndirect()) {
            QTC::TC("qpdf", "QPDF_optimization indirect outlines");
            root.replaceKey("/Outlines", makeIndirectObject(outlines));
        }
    }

    // Traverse pages tree pushing all inherited resources down to the page level.  This also
    // initializes m->all_pages.
    pushInheritedAttributesToPage(allow_changes, false);

    // Traverse pages
    int n = toI(m->all_pages.size());
    for (int pageno = 0; pageno < n; ++pageno) {
        updateObjectMaps(
            ObjUser(ObjUser::ou_page, pageno),
            m->all_pages.at(toS(pageno)),
            skip_stream_parameters);
    }

    // Traverse document-level items
    for (auto const& [key, value]: m->trailer.as_dictionary()) {
        if (key == "/Root") {
            // handled separately
        } else {
            if (!value.null()) {
                updateObjectMaps(
                    ObjUser(ObjUser::ou_trailer_key, key), value, skip_stream_parameters);
            }
        }
    }

    for (auto const& [key, value]: root.as_dictionary()) {
        // Technically, /I keys from /Thread dictionaries are supposed to be handled separately, but
        // we are going to disregard that specification for now.  There is loads of evidence that
        // pdlin and Acrobat both disregard things like this from time to time, so this is almost
        // certain not to cause any problems.
        if (!value.null()) {
            updateObjectMaps(ObjUser(ObjUser::ou_root_key, key), value, skip_stream_parameters);
        }
    }

    ObjUser root_ou = ObjUser(ObjUser::ou_root);
    auto root_og = QPDFObjGen(root.getObjGen());
    m->obj_user_to_objects[root_ou].insert(root_og);
    m->object_to_obj_users[root_og].insert(root_ou);

    filterCompressedObjects(object_stream_data);
}